

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O1

void encoderEngine(Territory ccode,EncodeRec *enc,int stop_with_one_result,int extraDigits,
                  int requiredEncoder,Territory ccode_override)

{
  ushort *puVar1;
  TerritoryBoundary *b;
  char *pcVar2;
  long lVar3;
  int firstcode;
  uint uVar4;
  Mapcodes *pMVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint *puVar16;
  size_t sVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  char *pcVar22;
  int GOODROUNDER;
  char (*territoryISO) [29];
  char *result_00;
  int iVar23;
  int iVar24;
  Territory ccode_00;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  long lVar28;
  int iVar29;
  int *piVar30;
  int iVar31;
  char cVar32;
  int iVar33;
  uint uVar34;
  int iVar35;
  long lVar36;
  bool bVar37;
  int local_138;
  int local_128;
  int *local_e0;
  uint *local_d8;
  undefined8 local_c0;
  char result [128];
  
  uVar26 = (ulong)(uint)ccode_override;
  if (999 < ccode && enc != (EncodeRec *)0x0) {
    firstcode = *(int *)("" + (long)ccode * 4 + 0x28c);
    lVar36 = (long)firstcode;
    iVar10 = *(int *)("" + (long)ccode * 4 + 0x290);
    lVar3 = (long)iVar10 + -1;
    iVar9 = fitsInsideBoundaries(&enc->coord32,TERRITORY_BOUNDARIES + lVar3);
    if ((iVar9 != 0) && (result[0] = '\0', firstcode < iVar10)) {
      if (requiredEncoder == -1) {
        requiredEncoder = ccode;
      }
      local_d8 = (uint *)(&DAT_00255e9c + lVar36 * 0x14);
      local_e0 = &TERRITORY_BOUNDARIES[lVar36].flags;
      iVar9 = 0;
      local_c0 = (long)iVar10;
LAB_001d0ab9:
      b = TERRITORY_BOUNDARIES + lVar36;
      iVar10 = fitsInsideBoundaries(&enc->coord32,b);
      if (iVar10 == 0) goto LAB_001d1322;
      uVar12 = TERRITORY_BOUNDARIES[lVar36].flags;
      iVar10 = (int)uVar12 >> 0x10;
      if ((uVar12 & 0x40) != 0) {
        iVar19 = (int)lVar36;
        iVar15 = countNamelessRecords(iVar19,firstcode);
        iVar14 = firstNamelessRecord(iVar19,firstcode);
        iVar19 = iVar19 - iVar14;
        result[0] = '\0';
        uVar11 = TERRITORY_BOUNDARIES[lVar36].flags & 0x1f;
        uVar11 = uVar11 + (uVar11 / 5) * 5 + 1;
        if ((uVar11 == 0x15) || (0x1f < iVar15)) {
          if ((uVar11 == 0x15) || (0x3d < iVar15)) {
            lVar21 = 0x1b4d89f;
            if (uVar11 == 0x15) {
              lVar21 = 0xe1781;
            }
            iVar14 = (int)(lVar21 / (long)iVar15);
            if (iVar15 == 0x3e) {
              iVar14 = iVar14 + 1;
            }
            else {
              iVar14 = (iVar14 / 0x3c1) * 0x3c1;
            }
            iVar14 = iVar14 * iVar19;
          }
          else if (iVar19 < 0x3e - iVar15) {
            iVar14 = iVar19 * 0xe1781;
          }
          else {
            iVar29 = ((((iVar19 + iVar15) - (iVar19 + iVar15 + -0x3e >> 0x1f)) + -0x3e >> 1) +
                     (0x3e - iVar15)) * 0xe1781;
            iVar14 = iVar29 + 0x745f0;
            if ((iVar19 + iVar15 & 1U) == 0) {
              iVar14 = iVar29;
            }
          }
        }
        else {
          iVar14 = (int)(0x1f % (long)iVar15);
          if (iVar19 < iVar14) {
            iVar14 = iVar19;
          }
          iVar14 = (iVar14 + (int)(0x1f / (long)iVar15) * iVar19) * 0xe1781;
        }
        uVar4 = TERRITORY_BOUNDARIES[lVar36].miny;
        iVar19 = TERRITORY_BOUNDARIES[lVar36].maxy;
        uVar27 = uVar4;
        if ((int)uVar4 < 0) {
          iVar29 = 0x168;
          if (iVar19 < 0) {
            uVar27 = -iVar19;
            goto LAB_001d0fe4;
          }
        }
        else {
LAB_001d0fe4:
          iVar29 = *(int *)(xDivider4_xdivider19 + (ulong)(uVar27 >> 0x13) * 4);
        }
        iVar33 = (enc->coord32).lonMicroDeg - b->minx;
        iVar23 = (enc->fraclon / 810000 + iVar33 * 4) / iVar29;
        iVar24 = iVar19 - (enc->coord32).latMicroDeg;
        iVar20 = iVar24 / 0x5a;
        iVar24 = iVar24 % 0x5a;
        if (iVar24 == 0) {
          iVar24 = 0;
          if (0 < enc->fraclat) {
            iVar24 = 0x5a;
          }
          iVar20 = iVar20 - (uint)(0 < enc->fraclat);
        }
        if ((uVar12 >> 10 & 1) == 0) {
          iVar20 = iVar20 + iVar23 * iVar10;
        }
        else {
          iVar35 = (int)(iVar19 - uVar4) >> 0x1f;
          iVar31 = -iVar35;
          iVar35 = (int)(iVar19 - uVar4) / 0x5a + iVar35;
          iVar19 = iVar23 / 6;
          iVar13 = (int)((long)(ulong)(uint)(iVar10 * iVar10) / (long)(iVar35 + iVar31 + 1));
          iVar6 = (iVar13 + -4) / 6;
          iVar13 = iVar13 + iVar6 * -6;
          iVar7 = iVar6;
          if (iVar19 < iVar6) {
            iVar7 = iVar19;
          }
          if (iVar19 < iVar6) {
            iVar13 = 6;
          }
          iVar20 = iVar23 + iVar7 * (iVar35 + iVar31) * 6 + iVar13 * iVar20;
        }
        lVar28 = (ulong)(uVar11 % 10) + (ulong)uVar11 / 10;
        result[lVar28 + 1] = '\0';
        lVar21 = lVar28 + 2;
        iVar14 = iVar20 + iVar14;
        do {
          result[lVar21 + -2] = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[iVar14 % 0x1f];
          lVar21 = lVar21 + -1;
          iVar14 = iVar14 / 0x1f;
        } while (1 < lVar21);
        lVar21 = lVar28;
        if (uVar11 == 0xd) {
          lVar21 = 3;
        }
        *(undefined4 *)(result + lVar21) = *(undefined4 *)(result + lVar21 + -1);
        result[lVar21 + -1] = '.';
        if (((((uVar12 >> 10 & 1) == 0) && (iVar10 == 0x3c1)) && (uVar11 == 0x16)) &&
           (iVar15 < 0x3e)) {
          cVar32 = result[lVar28 + -2];
          result[lVar28 + -2] = result[lVar28];
          result[lVar28] = cVar32;
        }
        iVar10 = iVar33 * 4 - iVar23 * iVar29;
        iVar15 = 0x5a;
        goto LAB_001d122c;
      }
      if ((uVar12 >> 8 & 1) != 0) {
        uVar12 = TERRITORY_BOUNDARIES[lVar36].flags & 0x1f;
        uVar12 = uVar12 + (uVar12 / 5) * 5 + 1;
        puVar16 = local_d8;
        piVar8 = local_e0;
        lVar21 = 0;
        do {
          lVar28 = lVar21;
          piVar30 = piVar8;
          if ((*puVar16 >> 8 & 1) == 0) break;
          uVar11 = *puVar16 & 0x1f;
          puVar16 = puVar16 + -5;
          piVar8 = piVar30 + -5;
          lVar21 = lVar28 + 1;
        } while (uVar11 + (uVar11 / 5) * 5 + 1 == uVar12);
        iVar10 = 0xe1781;
        if (0x16 < uVar12) {
          iVar10 = 0x1b4d89f;
        }
        iVar14 = 0;
        do {
          uVar11 = piVar30[-3];
          uVar4 = piVar30[-1];
          uVar27 = uVar11;
          if ((int)uVar11 < 0) {
            iVar15 = 0x168;
            if ((int)uVar4 < 0) {
              uVar27 = -uVar4;
              goto LAB_001d0cc1;
            }
          }
          else {
LAB_001d0cc1:
            iVar15 = *(int *)(xDivider4_xdivider19 + (ulong)(uVar27 >> 0x13) * 4);
          }
          iVar20 = uVar4 - uVar11;
          iVar19 = (int)((ulong)((long)(iVar20 + 0x59) * -0x49f49f49) >> 0x20) + iVar20 + 0x59;
          iVar33 = piVar30[-2] - ((TerritoryBoundary *)(piVar30 + -4))->minx;
          iVar19 = (((iVar19 >> 6) - (iVar19 >> 0x1f)) + 0xaf) / 0xb0;
          iVar29 = ((iVar15 + iVar33 * 4 + -1) / iVar15 + 0xa7) / 0xa8;
          iVar15 = iVar19 * iVar29 * 0x745f;
          if ((*piVar30 & 0x180U) == 0x100) {
            iVar15 = iVar15 + iVar14 + iVar10 + -1;
            iVar15 = iVar15 - (iVar15 % iVar10 + iVar14);
          }
          bVar37 = lVar28 == 0;
          lVar28 = lVar28 + -1;
          if (bVar37) goto LAB_001d0da5;
          iVar14 = iVar15 + iVar14;
          piVar30 = piVar30 + 5;
        } while( true );
      }
      if ((lVar36 != (int)lVar3 || (uint)(ccode + ~TERRITORY_AAA) < 0xfffffdeb) ||
         (""[(uint)(ccode + ~_TERRITORY_MIN)] == '\0')) {
        if (((iVar9 != 0) || ((uVar12 & 0x200) == 0)) &&
           (uVar11 = TERRITORY_BOUNDARIES[lVar36].flags & 0x1f,
           uVar11 = uVar11 + (uVar11 / 5) * 5 + 1, uVar11 < 0x36)) {
          if ((char)uVar12 < '\0') {
            cVar32 = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[uVar12 >> 0xb & 0x1f];
          }
          else {
            cVar32 = '\0';
          }
          uVar12 = uVar11;
          if (uVar11 == 0xe) {
            uVar12 = 0x17;
          }
          uVar25 = (ulong)uVar12;
          if (uVar11 == 0x15) {
            uVar25 = 0x16;
          }
          result[0] = '\0';
          uVar26 = uVar25 / 10;
          if (iVar10 == 1) {
            uVar18 = (ulong)(uint)((int)(uVar25 / 10) * 4);
            iVar15 = *(int *)((long)X_SIDE + uVar18);
            iVar10 = *(int *)((long)Y_SIDE + uVar18);
          }
          else {
            iVar15 = NC[uVar26] / iVar10;
          }
          uVar12 = b->minx;
          uVar4 = TERRITORY_BOUNDARIES[lVar36].miny;
          local_138 = (int)(~uVar4 + TERRITORY_BOUNDARIES[lVar36].maxy + iVar10) / iVar10;
          local_128 = (int)(~uVar12 + TERRITORY_BOUNDARIES[lVar36].maxx + iVar15) / iVar15;
          iVar14 = (enc->coord32).latMicroDeg;
          iVar19 = (enc->coord32).lonMicroDeg;
          iVar29 = iVar19 - uVar12;
          if (iVar29 < 0) {
            iVar20 = 360000000;
LAB_001d1424:
            iVar29 = iVar29 + iVar20;
            iVar19 = iVar19 + iVar20;
          }
          else if (359999999 < iVar29) {
            iVar20 = -360000000;
            goto LAB_001d1424;
          }
          uVar27 = (int)(iVar14 - uVar4) / local_138;
          iVar29 = iVar29 / local_128;
          if ((iVar29 < iVar15) && ((int)uVar27 < iVar10)) {
            uVar34 = (uint)uVar25;
            if ((uVar34 < 0x1e) || (iVar15 == iVar10)) {
              iVar20 = ~uVar27 + iVar10 + iVar29 * iVar10;
            }
            else {
              iVar20 = iVar29 / 6;
              iVar24 = (iVar15 + -4) / 6;
              iVar33 = iVar24;
              if (iVar20 < iVar24) {
                iVar33 = iVar20;
              }
              iVar23 = iVar15 + iVar24 * -6;
              if (iVar20 < iVar24) {
                iVar23 = 6;
              }
              iVar20 = (iVar10 * 6 + -6) * iVar33 + iVar29 + (~uVar27 + iVar10) * iVar23;
            }
            uVar18 = (ulong)(cVar32 != '\0');
            result_00 = result + uVar18;
            result_00[uVar26] = '\0';
            if (9 < uVar34) {
              lVar21 = uVar26 + 1;
              do {
                result[lVar21 + uVar18 + -2] = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[iVar20 % 0x1f];
                lVar21 = lVar21 + -1;
                iVar20 = iVar20 / 0x1f;
              } while (1 < lVar21);
            }
            if (((iVar10 == 0x3c1) && (uVar34 - 0x28 < 10)) && (iVar15 == 0x3c1)) {
              puVar1 = (ushort *)(result + uVar18 + 1);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            }
            uVar34 = uVar34 + (int)(uVar25 / 10) * -10;
            pcVar2 = result_00 + uVar26;
            iVar10 = Y_SIDE[uVar34];
            iVar20 = (local_138 + iVar10 + -1) / iVar10;
            iVar24 = (X_SIDE[uVar34] + local_128 + -1) / X_SIDE[uVar34];
            iVar19 = iVar19 - (uVar12 + iVar29 * local_128);
            *pcVar2 = '.';
            iVar29 = iVar19 / iVar24;
            iVar14 = iVar14 - (uVar4 + uVar27 * local_138);
            iVar15 = ~(iVar14 / iVar20) + iVar10;
            if (uVar34 == 3) {
              encodeTriple(pcVar2 + 1,iVar29,iVar15);
            }
            else {
              (pcVar2 + 1)[uVar34] = '\0';
              if (uVar34 != 0) {
                lVar21 = (ulong)(uint)((int)(uVar25 / 10) * 2) * -5 + uVar25 + 1;
                pcVar22 = result + uVar18 + uVar25 + uVar26 * -9;
                iVar10 = iVar15 + iVar29 * iVar10;
                do {
                  *pcVar22 = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[iVar10 % 0x1f];
                  lVar21 = lVar21 + -1;
                  pcVar22 = pcVar22 + -1;
                  iVar10 = iVar10 / 0x1f;
                } while (1 < lVar21);
                if (uVar34 == 4) {
                  puVar1 = (ushort *)(pcVar2 + 2);
                  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
                }
              }
            }
            if (uVar11 == 0xe) {
              result[uVar18 + 2] = result[uVar18 + 1];
              result[uVar18 + 1] = '.';
            }
            uVar26 = (ulong)(uint)extraDigits;
            encodeExtension(result_00,iVar19 % iVar24 << 2,iVar14 % iVar20,iVar24 << 2,iVar20,
                            extraDigits,1,enc);
            if (cVar32 != '\0') {
              result[uVar18 - 1] = cVar32;
            }
          }
        }
        goto LAB_001d1240;
      }
      ccode_00 = TERRITORY_NONE;
      if (0xfffffdea < (uint)(ccode + ~TERRITORY_AAA)) {
        ccode_00 = PARENT_NR[""[(uint)(ccode + ~_TERRITORY_MIN)]];
      }
      encoderEngine(ccode_00,enc,stop_with_one_result,extraDigits,ccode,(Territory)uVar26);
    }
  }
  return;
LAB_001d0da5:
  iVar15 = (iVar20 + iVar19 * 0xb0 + -1) / (iVar19 * 0xb0);
  iVar24 = uVar4 - (enc->coord32).latMicroDeg;
  iVar10 = iVar24 / iVar15;
  iVar24 = iVar24 % iVar15;
  if (iVar24 == 0) {
    iVar24 = 0;
    if (0 < enc->fraclat) {
      iVar24 = iVar15;
    }
    iVar10 = iVar10 - (uint)(0 < enc->fraclat);
  }
  iVar23 = (enc->coord32).lonMicroDeg - ((TerritoryBoundary *)(piVar30 + -4))->minx;
  iVar29 = iVar29 * 0xa8;
  iVar29 = (iVar33 + iVar29 + -1) / iVar29;
  iVar20 = iVar23 / iVar29;
  uVar12 = uVar12 % 10 + uVar12 / 10;
  uVar26 = (ulong)uVar12;
  result[uVar26 - 2] = '\0';
  if (2 < uVar12) {
    lVar21 = (uVar26 - 2 & 0xffffffff) + 1;
    iVar14 = iVar10 / 0xb0 + iVar14 / 0x745f + (iVar20 / 0xa8) * iVar19;
    do {
      result[lVar21 + -2] = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[iVar14 % 0x1f];
      lVar21 = lVar21 + -1;
      iVar14 = iVar14 / 0x1f;
    } while (1 < lVar21);
  }
  result[uVar26 - 2] = '.';
  encodeTriple(result + ((ulong)uVar12 - 1),iVar20 % 0xa8,iVar10 % 0xb0);
  iVar10 = iVar23 % iVar29 << 2;
  iVar29 = iVar29 << 2;
LAB_001d122c:
  uVar26 = (ulong)(uint)extraDigits;
  encodeExtension(result,iVar10,iVar24,iVar29,iVar15,extraDigits,-1,enc);
LAB_001d1240:
  if (result[0] != '\0') {
    repackIfAllDigits(result,0);
    if ((result[0] != '\0') && (pMVar5 = enc->mapcodes, pMVar5 != (Mapcodes *)0x0)) {
      iVar10 = pMVar5->count;
      if ((long)iVar10 < 0x16) {
        pMVar5->count = iVar10 + 1;
        territoryISO = pMVar5->mapcode + iVar10;
        if (requiredEncoder == TERRITORY_AAA) {
          strcpy(*territoryISO,result);
        }
        else {
          getTerritoryIsoName(*territoryISO,requiredEncoder,0);
          sVar17 = strlen(*territoryISO);
          (*territoryISO + sVar17)[0] = ' ';
          (*territoryISO + sVar17)[1] = '\0';
          strcat(*territoryISO,result);
        }
      }
    }
    if (stop_with_one_result != 0) {
      return;
    }
    if (lVar36 == -1) {
      return;
    }
    iVar9 = iVar9 + 1;
    result[0] = '\0';
  }
LAB_001d1322:
  lVar36 = lVar36 + 1;
  local_d8 = local_d8 + 5;
  local_e0 = local_e0 + 5;
  if ((int)local_c0 == (int)lVar36) {
    return;
  }
  goto LAB_001d0ab9;
}

Assistant:

static void encoderEngine(const enum Territory ccode, const EncodeRec *enc, const int stop_with_one_result,
                          const int extraDigits, const int requiredEncoder, const enum Territory ccode_override) {
    int from;
    int upto;
    ASSERT(enc);
    ASSERT((0 <= extraDigits) && (extraDigits <= MAX_PRECISION_DIGITS));

    if (!enc || (ccode < _TERRITORY_MIN)) {
        return;
    } // bad arguments

    from = firstRec(ccode);
    upto = lastRec(ccode);

    if (!fitsInsideBoundaries(&enc->coord32, TERRITORY_BOUNDARY(upto))) {
        return;
    }

    ///////////////////////////////////////////////////////////
    // look for encoding options
    ///////////////////////////////////////////////////////////
    {
        int i;
        char result[128];
        int result_counter = 0;

        *result = 0;
        for (i = from; i <= upto; i++) {
            if (fitsInsideBoundaries(&enc->coord32, TERRITORY_BOUNDARY(i))) {
                if (IS_NAMELESS(i)) {
                    encodeNameless(result, enc, ccode, extraDigits, i);
                } else if (REC_TYPE(i) > 1) {
                    encodeAutoHeader(result, enc, i, extraDigits);
                } else if ((i == upto) && isSubdivision(ccode)) {
                    // *** do a recursive call for the parent ***
                    encoderEngine(parentTerritoryOf(ccode), enc, stop_with_one_result, extraDigits, requiredEncoder,
                                  ccode);
                    return;
                } else // must be grid
                {
                    // skip IS_RESTRICTED records unless there already is a result
                    if (result_counter || !IS_RESTRICTED(i)) {
                        if (coDex(i) < 54) {
                            char headerletter = (char) ((REC_TYPE(i) == 1) ? HEADER_LETTER(i) : 0);
                            encodeGrid(result, enc, i, extraDigits, headerletter);
                        }
                    }
                }

                // =========== handle result (if any)
                if (*result) {
                    result_counter++;

                    repackIfAllDigits(result, 0);

                    if ((requiredEncoder < 0) || (requiredEncoder == i)) {
                        const enum Territory ccodeFinal = (ccode_override != TERRITORY_NONE ? ccode_override : ccode);
                        if (*result && enc->mapcodes && (enc->mapcodes->count < MAX_NR_OF_MAPCODE_RESULTS)) {
                            char *s = enc->mapcodes->mapcode[enc->mapcodes->count++];
                            if (ccodeFinal == TERRITORY_AAA) { // AAA is never shown with territory
                                strcpy(s, result);
                            } else {
                                getTerritoryIsoName(s, ccodeFinal, 0);
                                strcat(s, " ");
                                strcat(s, result);
                            }
                        }
                        if (requiredEncoder == i) {
                            return;
                        }
                    }
                    if (stop_with_one_result) {
                        return;
                    }
                    *result = 0; // clear for next iteration
                }
            }
        } // for i
    }
}